

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

void __thiscall
google::protobuf::util::Status::Status(Status *this,Code error_code,StringPiece error_message)

{
  char *pcVar1;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  pcVar1 = error_message.ptr_;
  this->error_code_ = error_code;
  (this->error_message_)._M_dataplus._M_p = (pointer)&(this->error_message_).field_2;
  (this->error_message_)._M_string_length = 0;
  (this->error_message_).field_2._M_local_buf[0] = '\0';
  if (error_code != OK) {
    local_40 = &local_30;
    if (pcVar1 == (char *)0x0) {
      local_38 = 0;
      local_30 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,pcVar1,pcVar1 + error_message.length_);
    }
    std::__cxx11::string::operator=((string *)&this->error_message_,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
  }
  return;
}

Assistant:

Status::Status(error::Code error_code, StringPiece error_message)
    : error_code_(error_code) {
  if (error_code != error::OK) {
    error_message_ = error_message.ToString();
  }
}